

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

void __thiscall spdlog::logger::~logger(logger *this)

{
  logger *this_local;
  
  this->_vptr_logger = (_func_int **)&PTR__logger_00158ab0;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&this->_err_handler);
  std::shared_ptr<spdlog::formatter>::~shared_ptr(&this->_formatter);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::~vector(&this->_sinks);
  std::__cxx11::string::~string((string *)&this->_name);
  return;
}

Assistant:

inline spdlog::logger::~logger() = default;